

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O3

double AndersonDarlingInf(double z)

{
  double dVar1;
  double dVar2;
  
  if (z < 2.0) {
    dVar1 = exp(-1.2337141 / z);
    if (z < 0.0) {
      dVar2 = sqrt(z);
    }
    else {
      dVar2 = SQRT(z);
    }
    return ((0.247105 - (0.0649821 - (0.0347962 - (z * -0.00168691 + 0.011672) * z) * z) * z) * z +
           2.00012) * (dVar1 / dVar2);
  }
  dVar1 = exp(1.0776 - (2.30695 - (0.43424 - (0.082433 - (z * -0.0003146 + 0.008056) * z) * z) * z)
                       * z);
  dVar1 = exp(-dVar1);
  return dVar1;
}

Assistant:

double AndersonDarlingInf(double z) {
  if (z < 2) {
    return exp(-1.2337141 / z) / sqrt(z) * (2.00012 + (0.247105 -
                (0.0649821 - (0.0347962 - (0.011672 - 0.00168691
                * z) * z) * z) * z) * z);
  }
  return exp( - exp(1.0776 - (2.30695 - (0.43424 - (0.082433 -
                    (0.008056 - 0.0003146 * z) * z) * z) * z) * z));
}